

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reformat.c
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  yajl_status yVar2;
  int iVar3;
  yajl_gen_status yVar4;
  yajl_gen g;
  yajl_handle h;
  size_t sVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  yajl_gen_option opt;
  char *__s;
  ulong uVar9;
  size_t len;
  uchar *buf;
  size_t local_40;
  uchar *local_38;
  
  g = yajl_gen_alloc((yajl_alloc_funcs *)0x0);
  yajl_gen_config(g,yajl_gen_beautify,1);
  yajl_gen_config(g,yajl_gen_validate_utf8,1);
  h = yajl_alloc(&callbacks,(yajl_alloc_funcs *)0x0,g);
  yajl_config(h,yajl_allow_comments,1);
  if (1 < argc) {
    uVar8 = 1;
    do {
      __s = argv[uVar8];
      if ((*__s != '-') || (sVar5 = strlen(__s), sVar5 < 2)) {
LAB_0010259a:
        main_cold_1();
        yVar4 = yajl_gen_null((yajl_gen)argv);
        if ((yVar4 == yajl_gen_generation_complete) && ((s_streamReformat & 1) != 0)) {
          yajl_gen_reset((yajl_gen)argv,"\n");
          yVar4 = yajl_gen_null((yajl_gen)argv);
        }
        return (int)(yVar4 == yajl_gen_status_ok);
      }
      uVar1 = 2;
      uVar9 = 1;
      do {
        uVar7 = uVar1;
        switch((int)__s[uVar9] - 0x65U >> 1 | (uint)(((int)__s[uVar9] - 0x65U & 1) != 0) << 0x1f) {
        case 0:
          opt = yajl_gen_escape_solidus;
          uVar6 = 1;
          goto LAB_00102446;
        default:
          main_cold_4();
          goto LAB_0010259a;
        case 4:
          opt = yajl_gen_beautify;
          uVar6 = 0;
LAB_00102446:
          yajl_gen_config(g,opt,uVar6);
          break;
        case 7:
          yajl_config(h,yajl_allow_multiple_values,1);
          s_streamReformat = 1;
          break;
        case 8:
          yajl_config(h,yajl_dont_validate_strings,1);
        }
        __s = argv[uVar8];
        sVar5 = strlen(__s);
        uVar1 = (ulong)((int)uVar7 + 1);
        uVar9 = uVar7;
      } while (uVar7 < sVar5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)argc);
  }
  sVar5 = fread(main::fileData,1,0xffff,_stdin);
  if (sVar5 != 0) {
    do {
      main::fileData[sVar5] = '\0';
      yVar2 = yajl_parse(h,main::fileData,sVar5);
      if (yVar2 != yajl_status_ok) goto LAB_00102540;
      yajl_gen_get_buf(g,&local_38,&local_40);
      fwrite(local_38,1,local_40,_stdout);
      yajl_gen_clear(g);
      sVar5 = fread(main::fileData,1,0xffff,_stdin);
    } while (sVar5 != 0);
  }
  iVar3 = feof(_stdin);
  if (iVar3 == 0) {
    main_cold_2();
    iVar3 = 1;
  }
  else {
LAB_00102540:
    iVar3 = 0;
  }
  yVar2 = yajl_complete_parse(h);
  if (yVar2 != yajl_status_ok) {
    main_cold_3();
    iVar3 = 1;
  }
  yajl_gen_free(g);
  yajl_free(h);
  return iVar3;
}

Assistant:

int
main(int argc, char ** argv)
{
    yajl_handle hand;
    static unsigned char fileData[65536];
    /* generator config */
    yajl_gen g;
    yajl_status stat;
    size_t rd;
    int retval = 0;
    int a = 1;

    g = yajl_gen_alloc(NULL);
    yajl_gen_config(g, yajl_gen_beautify, 1);
    yajl_gen_config(g, yajl_gen_validate_utf8, 1);

    /* ok.  open file.  let's read and parse */
    hand = yajl_alloc(&callbacks, NULL, (void *) g);
    /* and let's allow comments by default */
    yajl_config(hand, yajl_allow_comments, 1);

    /* check arguments.*/
    while ((a < argc) && (argv[a][0] == '-') && (strlen(argv[a]) > 1)) {
        unsigned int i;
        for ( i=1; i < strlen(argv[a]); i++) {
            switch (argv[a][i]) {
                case 'm':
                    yajl_gen_config(g, yajl_gen_beautify, 0);
                    break;
                case 's':
                    yajl_config(hand, yajl_allow_multiple_values, 1);
                    s_streamReformat = 1;
                    break;
                case 'u':
                    yajl_config(hand, yajl_dont_validate_strings, 1);
                    break;
                case 'e':
                    yajl_gen_config(g, yajl_gen_escape_solidus, 1);
                    break;
                default:
                    fprintf(stderr, "unrecognized option: '%c'\n\n",
                            argv[a][i]);
                    usage(argv[0]);
            }
        }
        ++a;
    }
    if (a < argc) {
        usage(argv[0]);
    }


    for (;;) {
        rd = fread((void *) fileData, 1, sizeof(fileData) - 1, stdin);

        if (rd == 0) {
            if (!feof(stdin)) {
                fprintf(stderr, "error on file read.\n");
                retval = 1;
            }
            break;
        }
        fileData[rd] = 0;

        stat = yajl_parse(hand, fileData, rd);

        if (stat != yajl_status_ok) break;

        {
            const unsigned char * buf;
            size_t len;
            yajl_gen_get_buf(g, &buf, &len);
            fwrite(buf, 1, len, stdout);
            yajl_gen_clear(g);
        }
    }

    stat = yajl_complete_parse(hand);

    if (stat != yajl_status_ok) {
        unsigned char * str = yajl_get_error(hand, 1, fileData, rd);
        fprintf(stderr, "%s", (const char *) str);
        yajl_free_error(hand, str);
        retval = 1;
    }

    yajl_gen_free(g);
    yajl_free(hand);

    return retval;
}